

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTessellationInputPatchDiscard::deinitRun
          (TessellationShaderTessellationInputPatchDiscard *this,_run *run)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (run->po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    run->po_id = 0;
  }
  if (run->tc_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    run->tc_id = 0;
  }
  if (run->te_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    run->te_id = 0;
  }
  return;
}

Assistant:

void TessellationShaderTessellationInputPatchDiscard::deinitRun(_run& run)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (run.po_id != 0)
	{
		gl.deleteProgram(run.po_id);

		run.po_id = 0;
	}

	if (run.tc_id != 0)
	{
		gl.deleteShader(run.tc_id);

		run.tc_id = 0;
	}

	if (run.te_id != 0)
	{
		gl.deleteShader(run.te_id);

		run.te_id = 0;
	}
}